

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

Vec_Ptr_t * Hop_ManDfs(Hop_Man_t *p)

{
  undefined1 *puVar1;
  Vec_Ptr_t *vNodes;
  ulong uVar2;
  long lVar3;
  
  vNodes = Vec_PtrAlloc(p->nObjs[5] + p->nObjs[4]);
  for (lVar3 = 0; uVar2 = (ulong)p->nTableSize, lVar3 < (long)uVar2; lVar3 = lVar3 + 1) {
    if (p->pTable[lVar3] != (Hop_Obj_t *)0x0) {
      Hop_ManDfs_rec(p->pTable[lVar3],vNodes);
    }
  }
  for (lVar3 = 0; lVar3 < (int)uVar2; lVar3 = lVar3 + 1) {
    if (p->pTable[lVar3] != (Hop_Obj_t *)0x0) {
      puVar1 = &p->pTable[lVar3]->field_0x20;
      *puVar1 = *puVar1 & 0xef;
      uVar2 = (ulong)(uint)p->nTableSize;
    }
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Hop_ManDfs( Hop_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( Hop_ManNodeNum(p) );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ManDfs_rec( pObj, vNodes );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ObjClearMarkA(pObj);
    return vNodes;
}